

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatBackup.cpp
# Opt level: O1

void __thiscall FatBackup::backup(FatBackup *this,string *backupFile,int fat)

{
  FatSystem *this_00;
  uint uVar1;
  FILE *__s;
  ostream *poVar2;
  undefined8 uVar3;
  int size;
  int iVar4;
  int iVar5;
  ostringstream oss;
  char buffer [1024];
  long local_5b8;
  ostringstream local_5b0 [376];
  char local_438 [1032];
  
  iVar5 = (int)((this->super_FatModule).system)->fatSize;
  __s = fopen((backupFile->_M_dataplus)._M_p,"w+");
  iVar4 = iVar5 << (fat == 0);
  if (fat == 2) {
    local_5b8 = (long)(int)((this->super_FatModule).system)->fatSize;
  }
  else {
    local_5b8 = 0;
  }
  if (__s != (FILE *)0x0) {
    if (0 < iVar5) {
      iVar5 = 0;
      do {
        size = iVar4 - iVar5;
        if (0x3ff < size) {
          size = 0x400;
        }
        this_00 = (this->super_FatModule).system;
        uVar1 = FatSystem::readData(this_00,iVar5 + local_5b8 + this_00->fatStart,local_438,size);
        if (0 < (int)uVar1) {
          fwrite(local_438,(ulong)uVar1,1,__s);
        }
        iVar5 = iVar5 + uVar1;
      } while (iVar5 < iVar4);
    }
    fclose(__s);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Successfully wrote ",0x13);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(backupFile->_M_dataplus)._M_p,
                        backupFile->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5b0,"Unable to open file ",0x14);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_5b0,(backupFile->_M_dataplus)._M_p,
                      backupFile->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," for writing",0xc);
  uVar3 = __cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void FatBackup::backup(string backupFile, int fat)
{
    char buffer[CHUNKS_SIZES];
    int size = system.fatSize;
    int n = 0;
    int offset = 0;
    FILE *backup = fopen(backupFile.c_str(), "w+");

    if (fat == 0) {
        size *= 2;
    } 
    if (fat == 2) {
        offset = system.fatSize;
    }

    if (backup == NULL) {
        ostringstream oss;
        oss << "Unable to open file " << backupFile << " for writing";
        throw oss.str();
    }

    for (int i=0; i<size; i+=n) {
        int toRead = CHUNKS_SIZES;
        if (size-i < toRead) {
            toRead = size-i;
        }
        n = system.readData(system.fatStart+i+offset, buffer, toRead);
        if (n > 0) {
            fwrite(buffer, n, 1, backup);
        }
    }

    fclose(backup);
    cout << "Successfully wrote " << backupFile << " (" << size << ")" << endl;
}